

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::
NameResolverTest_NestInFileClassEnumEdition2024_Test::TestBody
          (NameResolverTest_NestInFileClassEnumEdition2024_Test *this)

{
  long *plVar1;
  FileDescriptor *this_00;
  EnumDescriptor *descriptor;
  EnumDescriptor *descriptor_00;
  Descriptor *this_01;
  EnumDescriptor *descriptor_01;
  char *pcVar2;
  string_view filename;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view contents;
  AssertHelper local_f0;
  AssertionResult gtest_ar;
  undefined1 local_d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined2 local_90;
  ClassNameResolver resolver;
  
  filename._M_str = "foo.proto";
  filename._M_len = 9;
  contents._M_str =
       "\n      edition = \"2024\";\n      import \"third_party/java/protobuf/java_features.proto\";\n      package proto2_unittest;\n      enum NestedInFileClassEnum {\n        option features.(pb.java).nest_in_file_class = YES;\n\n        FOO_DEFAULT = 0;\n        FOO_VALUE = 1;\n      }\n\n      enum UnnestedEnum {\n        BAR_DEFAULT = 0;\n        BAR_VALUE = 1;\n      }\n\n      message EnumWrapper {\n        enum NestedInEnumWrapper {\n          BAZ_DEFAULT = 0;\n          BAZ_VALUE = 1;\n        }\n      }\n                "
  ;
  contents._M_len = 0x1f7;
  NameResolverTest::BuildFileAndPopulatePool(&this->super_NameResolverTest,filename,contents);
  local_d8._8_8_ = &local_c0;
  local_d8[0] = false;
  local_d8[1] = false;
  local_d8[2] = false;
  local_d8[3] = false;
  local_d8[4] = true;
  local_d8[5] = false;
  local_d8._16_8_ = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0._M_p = (pointer)&local_a0;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90._0_1_ = false;
  local_90._1_1_ = true;
  ClassNameResolver::ClassNameResolver(&resolver,(Options *)local_d8);
  Options::~Options((Options *)local_d8);
  name._M_str = "foo.proto";
  name._M_len = 9;
  this_00 = DescriptorPool::FindFileByName(&(this->super_NameResolverTest).pool_,name);
  name_00._M_str = "NestedInFileClassEnum";
  name_00._M_len = 0x15;
  descriptor = FileDescriptor::FindEnumTypeByName(this_00,name_00);
  name_01._M_str = "UnnestedEnum";
  name_01._M_len = 0xc;
  descriptor_00 = FileDescriptor::FindEnumTypeByName(this_00,name_01);
  name_02._M_str = "EnumWrapper";
  name_02._M_len = 0xb;
  this_01 = FileDescriptor::FindMessageTypeByName(this_00,name_02);
  name_03._M_str = "NestedInEnumWrapper";
  name_03._M_len = 0x13;
  descriptor_01 = Descriptor::FindEnumTypeByName(this_01,name_03);
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_d8,&resolver,descriptor_00,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
            ((internal *)&gtest_ar,"resolver.GetClassName(unnested_enum, true)",
             "\"\" \"proto2_unittest.UnnestedEnum\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [29])"proto2_unittest.UnnestedEnum");
  std::__cxx11::string::~string((string *)local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x187,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar1 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_d8,&resolver,descriptor,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[47]>
            ((internal *)&gtest_ar,"resolver.GetClassName(nest_in_file_enum, true)",
             "\"\" \"proto2_unittest.FooProto.NestedInFileClassEnum\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [47])"proto2_unittest.FooProto.NestedInFileClassEnum");
  std::__cxx11::string::~string((string *)local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x18a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar1 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_d8,&resolver,descriptor_01,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[48]>
            ((internal *)&gtest_ar,"resolver.GetClassName(nested_in_enum_wrapper, true)",
             "\"\" \"proto2_unittest.EnumWrapper.NestedInEnumWrapper\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [48])"proto2_unittest.EnumWrapper.NestedInEnumWrapper");
  std::__cxx11::string::~string((string *)local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x18d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar1 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_
            ((string *)local_d8,&resolver,descriptor_00);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
            ((internal *)&gtest_ar,"resolver.GetJavaImmutableClassName(unnested_enum)",
             "\"\" \"proto2_unittest.UnnestedEnum\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [29])"proto2_unittest.UnnestedEnum");
  std::__cxx11::string::~string((string *)local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,399,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar1 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_((string *)local_d8,&resolver,descriptor);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[47]>
            ((internal *)&gtest_ar,"resolver.GetJavaImmutableClassName(nest_in_file_enum)",
             "\"\" \"proto2_unittest.FooProto$NestedInFileClassEnum\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [47])"proto2_unittest.FooProto$NestedInFileClassEnum");
  std::__cxx11::string::~string((string *)local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x191,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar1 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_
            ((string *)local_d8,&resolver,descriptor_01);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[48]>
            ((internal *)&gtest_ar,"resolver.GetJavaImmutableClassName(nested_in_enum_wrapper)",
             "\"\" \"proto2_unittest.EnumWrapper$NestedInEnumWrapper\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [48])"proto2_unittest.EnumWrapper$NestedInEnumWrapper");
  std::__cxx11::string::~string((string *)local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x193,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    plVar1 = (long *)CONCAT26(local_d8._6_2_,CONCAT24(local_d8._4_2_,local_d8._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ClassNameResolver::~ClassNameResolver(&resolver);
  return;
}

Assistant:

TEST_F(NameResolverTest, NestInFileClassEnumEdition2024) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2024";
      import "third_party/java/protobuf/java_features.proto";
      package proto2_unittest;
      enum NestedInFileClassEnum {
        option features.(pb.java).nest_in_file_class = YES;

        FOO_DEFAULT = 0;
        FOO_VALUE = 1;
      }

      enum UnnestedEnum {
        BAR_DEFAULT = 0;
        BAR_VALUE = 1;
      }

      message EnumWrapper {
        enum NestedInEnumWrapper {
          BAZ_DEFAULT = 0;
          BAZ_VALUE = 1;
        }
      }
                )schema");

  ClassNameResolver resolver;
  auto file = pool_.FindFileByName("foo.proto");
  auto nest_in_file_enum = file->FindEnumTypeByName("NestedInFileClassEnum");
  auto unnested_enum = file->FindEnumTypeByName("UnnestedEnum");
  auto nested_in_enum_wrapper = file->FindMessageTypeByName("EnumWrapper")
                                    ->FindEnumTypeByName("NestedInEnumWrapper");

  EXPECT_EQ(resolver.GetClassName(unnested_enum,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.UnnestedEnum");
  EXPECT_EQ(resolver.GetClassName(nest_in_file_enum,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.FooProto.NestedInFileClassEnum");
  EXPECT_EQ(resolver.GetClassName(nested_in_enum_wrapper,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.EnumWrapper.NestedInEnumWrapper");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(unnested_enum),
            PACKAGE_PREFIX "proto2_unittest.UnnestedEnum");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nest_in_file_enum),
            PACKAGE_PREFIX "proto2_unittest.FooProto$NestedInFileClassEnum");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nested_in_enum_wrapper),
            PACKAGE_PREFIX "proto2_unittest.EnumWrapper$NestedInEnumWrapper");
}